

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O3

OrderCancelReplaceRequest * __thiscall
Application::queryCancelReplaceRequest43
          (OrderCancelReplaceRequest *__return_storage_ptr__,Application *this)

{
  _func_int **pp_Var1;
  bool bVar2;
  Application *pAVar3;
  string *psVar4;
  string *psVar5;
  undefined1 local_230 [88];
  FieldBase local_1d8;
  FieldBase local_180;
  FieldBase local_128;
  FieldBase local_d0;
  FieldBase local_78;
  
  pAVar3 = this;
  queryOrigClOrdID((OrigClOrdID *)local_230,this);
  queryClOrdID((ClOrdID *)&local_d0,pAVar3);
  pAVar3 = (Application *)0x15;
  FIX::CharField::CharField((CharField *)&local_1d8,0x15,'1');
  local_1d8._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00152078;
  querySide((Side *)&local_128,pAVar3);
  FIX::TransactTime::TransactTime((TransactTime *)&local_180);
  queryOrdType((OrdType *)&local_78,pAVar3);
  pAVar3 = (Application *)local_230;
  FIX43::OrderCancelReplaceRequest::OrderCancelReplaceRequest
            (__return_storage_ptr__,(OrigClOrdID *)pAVar3,(ClOrdID *)&local_d0,
             (HandlInst *)&local_1d8,(Side *)&local_128,(TransactTime *)&local_180,
             (OrdType *)&local_78);
  FIX::FieldBase::~FieldBase(&local_78);
  FIX::FieldBase::~FieldBase(&local_180);
  FIX::FieldBase::~FieldBase(&local_128);
  FIX::FieldBase::~FieldBase(&local_1d8);
  FIX::FieldBase::~FieldBase(&local_d0);
  FIX::FieldBase::~FieldBase((FieldBase *)local_230);
  querySymbol((Symbol *)local_230,pAVar3);
  FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,(FieldBase *)local_230,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_230);
  pp_Var1 = (_func_int **)(local_230 + 0x10);
  psVar5 = (string *)local_230;
  local_230._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>(psVar5,"New price","");
  psVar4 = (string *)local_230;
  bVar2 = queryConfirm((Application *)psVar5,psVar4);
  if ((_func_int **)local_230._0_8_ != pp_Var1) {
    psVar4 = (string *)(local_230._16_8_ + 1);
    operator_delete((void *)local_230._0_8_,(ulong)psVar4);
  }
  if (bVar2) {
    queryPrice((Price *)local_230,(Application *)psVar4);
    FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,(FieldBase *)local_230,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_230);
  }
  psVar5 = (string *)local_230;
  local_230._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>(psVar5,"New quantity","");
  psVar4 = (string *)local_230;
  bVar2 = queryConfirm((Application *)psVar5,psVar4);
  if ((_func_int **)local_230._0_8_ != pp_Var1) {
    psVar4 = (string *)(local_230._16_8_ + 1);
    operator_delete((void *)local_230._0_8_,(ulong)psVar4);
  }
  if (bVar2) {
    queryOrderQty((OrderQty *)local_230,(Application *)psVar4);
    FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,(FieldBase *)local_230,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_230);
  }
  queryHeader(this,(Header *)&(__return_storage_ptr__->super_Message).field_0x70);
  return __return_storage_ptr__;
}

Assistant:

FIX43::OrderCancelReplaceRequest Application::queryCancelReplaceRequest43() {
  FIX43::OrderCancelReplaceRequest cancelReplaceRequest(
      queryOrigClOrdID(),
      queryClOrdID(),
      FIX::HandlInst('1'),
      querySide(),
      FIX::TransactTime(),
      queryOrdType());

  cancelReplaceRequest.set(querySymbol());
  if (queryConfirm("New price")) {
    cancelReplaceRequest.set(queryPrice());
  }
  if (queryConfirm("New quantity")) {
    cancelReplaceRequest.set(queryOrderQty());
  }

  queryHeader(cancelReplaceRequest.getHeader());
  return cancelReplaceRequest;
}